

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
fasttext::FastText::getNN
          (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,FastText *this,string *word,int32_t k)

{
  Matrix *wordVectors;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_92;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_91;
  Vector query;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  
  Vector::Vector(&query,(long)((this->args_).
                               super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                              )->dim);
  getWordVector(this,&query,word);
  lazyComputeWordVectors(this);
  wordVectors = (this->wordVectors_)._M_t.
                super___uniq_ptr_impl<fasttext::Matrix,_std::default_delete<fasttext::Matrix>_>._M_t
                .super__Tuple_impl<0UL,_fasttext::Matrix_*,_std::default_delete<fasttext::Matrix>_>.
                super__Head_base<0UL,_fasttext::Matrix_*,_false>._M_head_impl;
  if (wordVectors != (Matrix *)0x0) {
    std::__cxx11::string::string((string *)&local_78,(string *)word);
    __l._M_len = 1;
    __l._M_array = &local_78;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_58,__l,&local_91,&local_92);
    getNN(__return_storage_ptr__,this,wordVectors,&query,k,
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_58);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&query);
    return __return_storage_ptr__;
  }
  __assert_fail("wordVectors_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Whadup[P]weightedFastText/src/fasttext.cc"
                ,0x221,
                "std::vector<std::pair<real, std::string>> fasttext::FastText::getNN(const std::string &, int32_t)"
               );
}

Assistant:

std::vector<std::pair<real, std::string>> FastText::getNN(
		const std::string& word,
		int32_t k) {
	Vector query(args_->dim);

	getWordVector(query, word);

	lazyComputeWordVectors();
	assert(wordVectors_);
	return getNN(*wordVectors_, query, k, {word});
}